

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O3

void __thiscall
iutest::detail::
TypeParameterizedTestSuite<test::type_param_test::RegisterVerboseSpaceTypeParamTest,_iutest::detail::VariadicTemplateTypeList<test::type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::A,_test::type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::B>,_iutest::detail::VariadicTypeList<int>_>
::
EachTest<int,_iutest::detail::VariadicTemplateTypeList<test::type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::A,_test::type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::B>_>
::EachTest(EachTest<int,_iutest::detail::VariadicTemplateTypeList<test::type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::A,_test::type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::B>_>
           *this,TestSuite *testsuite,string *name)

{
  UnitTest *pUVar1;
  
  (this->super_iuIObject)._vptr_iuIObject = (_func_int **)&PTR__EachTest_003acd50;
  (this->m_mediator).super_iuITestSuiteMediator.m_test_suite = testsuite;
  (this->m_mediator).super_iuITestSuiteMediator._vptr_iuITestSuiteMediator =
       (_func_int **)&PTR__iuITestSuiteMediator_003a0120;
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_003acd88;
  TestInfo::TestInfo(&this->m_info,&(this->m_mediator).super_iuITestSuiteMediator,name,
                     &(this->m_factory).super_iuFactoryBase);
  pUVar1 = UnitTest::instance();
  (pUVar1->super_UnitTestImpl).m_total_test_num = (pUVar1->super_UnitTestImpl).m_total_test_num + 1;
  TestSuite::push_back(testsuite,&this->m_info);
  return;
}

Assistant:

EachTest(TestSuite* testsuite, const ::std::string& name)
            : m_mediator(testsuite)
            , m_info(&m_mediator, name, &m_factory)
        {
            UnitTest::instance().AddTestInfo(testsuite, &m_info);
        }